

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
construct<pbrt::FloatImageTexture,pbrt::TextureMapping2DHandle&,std::__cxx11::string&,std::__cxx11::string&,float&,pbrt::WrapMode&,float&,pbrt::ColorEncodingHandle&,pstd::pmr::polymorphic_allocator<std::byte>&>
          (polymorphic_allocator<std::byte> *this,FloatImageTexture *p,TextureMapping2DHandle *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,float *args_3,
          WrapMode *args_4,float *args_5,ColorEncodingHandle *args_6,
          polymorphic_allocator<std::byte> *args_7)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  string *in_RSI;
  string *in_RDI;
  ColorEncodingHandle *in_R8;
  TextureMapping2DHandle *unaff_retaddr;
  FloatImageTexture *in_stack_00000008;
  Allocator in_stack_00000010;
  ColorEncodingHandle *in_stack_ffffffffffffff88;
  Float scale;
  string *filter;
  
  scale = (Float)((ulong)in_RCX >> 0x20);
  filter = in_RSI;
  pbrt::TextureMapping2DHandle::TextureMapping2DHandle
            ((TextureMapping2DHandle *)in_RSI,(TextureMapping2DHandle *)in_stack_ffffffffffffff88);
  pbrt::ColorEncodingHandle::ColorEncodingHandle
            ((ColorEncodingHandle *)in_RSI,in_stack_ffffffffffffff88);
  pbrt::FloatImageTexture::FloatImageTexture
            (in_stack_00000008,unaff_retaddr,in_RDI,filter,(Float)((ulong)in_RDX >> 0x20),
             (WrapMode)in_RDX,scale,in_R8,in_stack_00000010);
  return;
}

Assistant:

void construct(T *p, Args &&... args) {
        ::new ((void *)p) T(std::forward<Args>(args)...);
    }